

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void jsonQuoteFunc(sqlite3_context *ctx,int argc,sqlite3_value **argv)

{
  byte *pbVar1;
  Mem *pMVar2;
  long in_FS_OFFSET;
  undefined1 local_a0 [48];
  undefined1 *local_70;
  undefined1 *puStack_68;
  undefined1 *local_60;
  undefined1 *puStack_58;
  undefined1 *local_50;
  undefined1 *puStack_48;
  undefined1 *local_40;
  undefined1 *puStack_38;
  undefined1 *local_30;
  undefined1 *puStack_28;
  undefined1 *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_a0._8_8_ = local_a0 + 0x22;
  local_a0._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_50 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_60 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_58 = &DAT_aaaaaaaaaaaaaaaa;
  local_70 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_68 = &DAT_aaaaaaaaaaaaaaaa;
  local_a0._16_8_ = 100;
  local_a0._24_8_ = 0;
  local_a0[0x20] = '\x01';
  local_a0[0x21] = '\0';
  local_a0[0x22] = -0x56;
  local_a0[0x23] = -0x56;
  local_a0[0x24] = -0x56;
  local_a0[0x25] = -0x56;
  local_a0[0x26] = -0x56;
  local_a0[0x27] = -0x56;
  local_a0._0_8_ = ctx;
  jsonAppendSqlValue((JsonString *)local_a0,*argv);
  jsonReturnString((JsonString *)local_a0,(JsonParse *)0x0,(sqlite3_context *)0x0);
  pMVar2 = ctx->pOut;
  pMVar2->eSubtype = 'J';
  pbVar1 = (byte *)((long)&pMVar2->flags + 1);
  *pbVar1 = *pbVar1 | 8;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void jsonQuoteFunc(
  sqlite3_context *ctx,
  int argc,
  sqlite3_value **argv
){
  JsonString jx;
  UNUSED_PARAMETER(argc);

  jsonStringInit(&jx, ctx);
  jsonAppendSqlValue(&jx, argv[0]);
  jsonReturnString(&jx, 0, 0);
  sqlite3_result_subtype(ctx, JSON_SUBTYPE);
}